

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_f(void *ctx,char *next)

{
  MPP_RET MVar1;
  uint uVar2;
  ulong uStack_30;
  MppFrameFormat format;
  long number;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  number = (long)ctx;
  if (next != (char *)0x0) {
    uStack_30 = 0;
    cmd = (MpiEncTestArgs *)next;
    next_local = (char *)ctx;
    MVar1 = str_to_frm_fmt(next,(long *)&stack0xffffffffffffffd0);
    if (MVar1 == MPP_OK) {
      uVar2 = (uint)uStack_30;
      if (((uStack_30 & 0x1000000) == 0) &&
         ((((uStack_30 & 0xf0000) == 0 && ((uVar2 & 0xfffff) < 0x14)) ||
          (((uVar2 & 0xf0000) == 0x10000 && ((uVar2 & 0xfffff) < 0x10010)))))) {
        *(uint *)(number + 0x28) = uVar2;
        return 1;
      }
      _mpp_log_l(2,"mpi_enc_utils","invalid input format 0x%x\n",0,uStack_30 & 0xffffffff);
    }
  }
  *(undefined4 *)(number + 0x28) = 0;
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_f(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        long number = 0;
        MppFrameFormat format = MPP_FMT_BUTT;

        if (MPP_OK == str_to_frm_fmt(next, &number)) {
            format = (MppFrameFormat)number;

            if (MPP_FRAME_FMT_IS_BE(format) &&
                (MPP_FRAME_FMT_IS_YUV(format) || MPP_FRAME_FMT_IS_RGB(format))) {
                cmd->format = format;
                return 1;
            }

            mpp_err("invalid input format 0x%x\n", format);
        }
    }

    cmd->format = MPP_FMT_YUV420SP;
    return 0;
}